

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFileSystem.cpp
# Opt level: O2

path * __thiscall
irr::io::CFileSystem::getRelativeFilename
          (path *__return_storage_ptr__,CFileSystem *this,path *filename,path *directory)

{
  char cVar1;
  u32 begin;
  __type _Var2;
  uint length;
  uint uVar3;
  uint uVar4;
  _List_node_base *p_Var5;
  _Self __tmp;
  list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> *plVar6;
  list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> list1;
  path path2;
  path ext;
  path file;
  list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> list2;
  
  plVar6 = &list1;
  if (((filename->str)._M_string_length == 0) || ((directory->str)._M_string_length == 0)) {
    core::string<char>::string(__return_storage_ptr__,filename);
  }
  else {
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2
    ;
    (__return_storage_ptr__->str)._M_string_length = 0;
    file.str._M_dataplus._M_p = (pointer)&file.str.field_2;
    file.str._M_string_length = 0;
    ext.str._M_dataplus._M_p = (pointer)&ext.str.field_2;
    ext.str._M_string_length = 0;
    file.str.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->str).field_2._M_local_buf[0] = '\0';
    ext.str.field_2._M_local_buf[0] = '\0';
    (*(this->super_IFileSystem)._vptr_IFileSystem[0x13])(&list1);
    uVar4 = ~(uint)list1.
                   super__List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>
                   ._M_impl._M_node.super__List_node_base._M_prev;
    length = (uint)list1.
                   super__List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>
                   ._M_impl._M_node.super__List_node_base._M_prev;
    begin = (uint)list1.
                  super__List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1;
    while (uVar3 = begin - 1, -1 < (int)uVar3) {
      cVar1 = *(char *)((long)&(list1.
                                super__List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>
                                ._M_impl._M_node.super__List_node_base._M_next)->_M_next +
                       (ulong)uVar3);
      if (cVar1 == '.') {
        core::string<char>::subString
                  (&path2,(string<char> *)&list1,begin,
                   (uint)list1.
                         super__List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>
                         ._M_impl._M_node.super__List_node_base._M_prev + uVar4,false);
        core::string<char>::operator=(&ext,&path2);
        ::std::__cxx11::string::_M_dispose();
        length = uVar3;
      }
      else if ((cVar1 == '/') || (cVar1 == '\\')) {
        core::string<char>::subString(&path2,(string<char> *)&list1,begin,length - begin,false);
        core::string<char>::operator=(&file,&path2);
        ::std::__cxx11::string::_M_dispose();
        core::string<char>::subString(&path2,(string<char> *)&list1,0,begin,false);
        core::string<char>::operator=(__return_storage_ptr__,&path2);
        ::std::__cxx11::string::_M_dispose();
        core::string<char>::replace(__return_storage_ptr__,'\\','/');
        goto LAB_0021be65;
      }
      uVar4 = uVar4 + 1;
      begin = uVar3;
    }
    core::string<char>::subString(&path2,(string<char> *)&list1,0,length,false);
    core::string<char>::operator=(&file,&path2);
    ::std::__cxx11::string::_M_dispose();
LAB_0021be65:
    ::std::__cxx11::string::_M_dispose();
    (*(this->super_IFileSystem)._vptr_IFileSystem[0x13])(&path2,this,directory);
    list1.super__List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>.
    _M_impl._M_node._M_size = 0;
    list2.super__List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>.
    _M_impl._M_node._M_size = 0;
    list1.super__List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&list1;
    list1.super__List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&list1;
    list2.super__List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&list2;
    list2.super__List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&list2;
    core::string<char>::
    split<std::__cxx11::list<irr::core::string<char>,std::allocator<irr::core::string<char>>>>
              (__return_storage_ptr__,&list1,"/\\",2,true,false);
    core::string<char>::
    split<std::__cxx11::list<irr::core::string<char>,std::allocator<irr::core::string<char>>>>
              (&path2,&list2,"/\\",2,true,false);
    p_Var5 = (_List_node_base *)&list2;
    do {
      plVar6 = *(list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> **)plVar6;
      p_Var5 = (((_List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> *)
                &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if ((plVar6 == &list1) || (p_Var5 == (_List_node_base *)&list2)) break;
      _Var2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)plVar6 + 0x10),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(p_Var5 + 1));
    } while (_Var2);
    core::string<char>::operator=(__return_storage_ptr__,"");
    for (; p_Var5 != (_List_node_base *)&list2; p_Var5 = p_Var5->_M_next) {
      core::string<char>::operator+=(__return_storage_ptr__,"../");
    }
    while (plVar6 != &list1) {
      plVar6 = *(list<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_> **)plVar6;
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      core::string<char>::append(__return_storage_ptr__,'/');
    }
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    if ((int)ext.str._M_string_length != 0) {
      core::string<char>::append(__return_storage_ptr__,'.');
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    std::__cxx11::_List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>::
    _M_clear(&list2.
              super__List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>);
    std::__cxx11::_List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>::
    _M_clear(&list1.
              super__List_base<irr::core::string<char>,_std::allocator<irr::core::string<char>_>_>);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  return __return_storage_ptr__;
}

Assistant:

path CFileSystem::getRelativeFilename(const path &filename, const path &directory) const
{
	if (filename.empty() || directory.empty())
		return filename;

	io::path path1, file, ext;
	core::splitFilename(getAbsolutePath(filename), &path1, &file, &ext);
	io::path path2(getAbsolutePath(directory));
	std::list<io::path> list1, list2;
	path1.split(list1, _IRR_TEXT("/\\"), 2);
	path2.split(list2, _IRR_TEXT("/\\"), 2);
	std::list<io::path>::const_iterator it1, it2;
	it1 = list1.begin();
	it2 = list2.begin();

#if defined(_IRR_WINDOWS_API_)
	fschar_t partition1 = 0, partition2 = 0;
	io::path prefix1, prefix2;
	if (it1 != list1.end())
		prefix1 = *it1;
	if (it2 != list2.end())
		prefix2 = *it2;
	if (prefix1.size() > 1 && prefix1[1] == _IRR_TEXT(':'))
		partition1 = core::locale_lower(prefix1[0]);
	if (prefix2.size() > 1 && prefix2[1] == _IRR_TEXT(':'))
		partition2 = core::locale_lower(prefix2[0]);

	// must have the same prefix or we can't resolve it to a relative filename
	if (partition1 != partition2) {
		return filename;
	}
#endif

	for (; it1 != list1.end() && it2 != list2.end()
#if defined(_IRR_WINDOWS_API_)
			&& (io::path(*it1).make_lower() == io::path(*it2).make_lower())
#else
			&& (*it1 == *it2)
#endif
					;) {
		++it1;
		++it2;
	}
	path1 = _IRR_TEXT("");
	for (; it2 != list2.end(); ++it2)
		path1 += _IRR_TEXT("../");
	while (it1 != list1.end()) {
		path1 += *it1++;
		path1 += _IRR_TEXT('/');
	}
	path1 += file;
	if (ext.size()) {
		path1 += _IRR_TEXT('.');
		path1 += ext;
	}
	return path1;
}